

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaffeConverterLib.cpp
# Opt level: O3

void convertCaffe(string *srcPath,string *dstPath,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *meanImageProtoPath,
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *imageInputs,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *isBGR,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                        *redBias,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *blueBias,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *greenBias,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *grayBias,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *scale,string *caffeProtoTxtPath,string *classLabelPath,
                 string *predictedFeatureName)

{
  ModelDescription **ppMVar1;
  bool bVar2;
  int iVar3;
  runtime_error *prVar4;
  string *psVar5;
  Result r;
  Model local_3d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
  caffeMeanImageBlob;
  NetParameter caffeNetwork;
  NetParameter caffeWeightsNetwork;
  Model modelSpec;
  stat buf;
  
  iVar3 = std::__cxx11::string::compare((char *)srcPath);
  if (iVar3 == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Required source model path --srcModelPath\n");
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)dstPath);
    if (iVar3 != 0) {
      iVar3 = stat((srcPath->_M_dataplus)._M_p,(stat *)&buf);
      if (iVar3 != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&modelSpec);
        ppMVar1 = &modelSpec.description_;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppMVar1,
                   "Unable to open caffe model provided in the source model path: ",0x3e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppMVar1,(srcPath->_M_dataplus)._M_p,srcPath->_M_string_length);
        std::endl<char,std::char_traits<char>>((ostream *)ppMVar1);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar4,(string *)&caffeNetwork);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      caffe::NetParameter::NetParameter(&caffeNetwork);
      caffe::NetParameter::NetParameter(&caffeWeightsNetwork);
      caffeMeanImageBlob._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &caffeMeanImageBlob._M_t._M_impl.super__Rb_tree_header._M_header;
      caffeMeanImageBlob._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      caffeMeanImageBlob._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      caffeMeanImageBlob._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      caffeMeanImageBlob._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           caffeMeanImageBlob._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar3 = std::__cxx11::string::compare((char *)caffeProtoTxtPath);
      if (iVar3 == 0) {
        CoreMLConverter::loadCaffeNetwork
                  (srcPath,&caffeWeightsNetwork,caffeProtoTxtPath,&caffeNetwork,meanImageProtoPath,
                   &caffeMeanImageBlob);
        caffe::NetParameter::CopyFrom(&caffeNetwork,&caffeWeightsNetwork);
      }
      else {
        CoreMLConverter::loadCaffeNetwork
                  (srcPath,&caffeWeightsNetwork,caffeProtoTxtPath,&caffeNetwork,meanImageProtoPath,
                   &caffeMeanImageBlob);
      }
      iVar3 = std::__cxx11::string::compare((char *)classLabelPath);
      if (iVar3 != 0) {
        iVar3 = stat((classLabelPath->_M_dataplus)._M_p,(stat *)&buf);
        if (iVar3 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&modelSpec);
          ppMVar1 = &modelSpec.description_;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppMVar1,"Unable to open class label file provided in the path: ",
                     0x36);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppMVar1,(classLabelPath->_M_dataplus)._M_p,
                     classLabelPath->_M_string_length);
          std::endl<char,std::char_traits<char>>((ostream *)ppMVar1);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar4,(string *)&r);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      CoreML::Specification::Model::Model(&modelSpec);
      CoreMLConverter::convertCaffeNetwork
                (&caffeWeightsNetwork,&caffeNetwork,&caffeMeanImageBlob,&modelSpec,isBGR,redBias,
                 blueBias,greenBias,grayBias,scale,imageInputs,classLabelPath,predictedFeatureName);
      CoreML::Model::Model(&local_3d0,&modelSpec);
      CoreML::Model::save(&r,&local_3d0,dstPath);
      CoreML::Model::~Model(&local_3d0);
      bVar2 = CoreML::Result::good(&r);
      if (bVar2) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)r.m_message._M_dataplus._M_p != &r.m_message.field_2) {
          operator_delete(r.m_message._M_dataplus._M_p,r.m_message.field_2._M_allocated_capacity + 1
                         );
        }
        CoreML::Specification::Model::~Model(&modelSpec);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
        ::~_Rb_tree(&caffeMeanImageBlob._M_t);
        caffe::NetParameter::~NetParameter(&caffeWeightsNetwork);
        caffe::NetParameter::~NetParameter(&caffeNetwork);
        return;
      }
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      psVar5 = CoreML::Result::message_abi_cxx11_(&r);
      std::runtime_error::runtime_error(prVar4,(string *)psVar5);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Required destination model path --dstModelPath\n");
  }
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void convertCaffe(const std::string& srcPath,
                  const std::string& dstPath,
                  const std::map<std::string, std::string>& meanImageProtoPath,
                  const std::set<std::string>& imageInputs,
                  const std::map<std::string, bool>& isBGR,
                  const std::map<std::string, double>& redBias,
                  const std::map<std::string, double>& blueBias,
                  const std::map<std::string, double>& greenBias,
                  const std::map<std::string, double>& grayBias,
                  const std::map<std::string, double>& scale,
                  const std::string& caffeProtoTxtPath,
                  const std::string& classLabelPath,
                  const std::string& predictedFeatureName) {

    if (srcPath == "") {
        throw std::runtime_error("Required source model path --srcModelPath\n");
    }
    
    if (dstPath == "") {
        throw std::runtime_error("Required destination model path --dstModelPath\n");
    }

    struct stat buf;
    int statResult = stat(srcPath.c_str(), &buf);
    if (statResult != 0) {
        std::stringstream ss;
        ss << "Unable to open caffe model provided in the source model path: ";
        ss << srcPath;
        ss << std::endl;
        throw std::runtime_error(ss.str());
    }
    
    // Load the caffe network
    caffe::NetParameter caffeNetwork;
    caffe::NetParameter caffeWeightsNetwork;
    std::map<std::string, caffe::BlobProto> caffeMeanImageBlob;
    
    // TODO: We need to use only one caffe network proto variable
    // This is a workaround for that.
    if (caffeProtoTxtPath != "") {
        CoreMLConverter::loadCaffeNetwork(srcPath, caffeWeightsNetwork, caffeProtoTxtPath, caffeNetwork, meanImageProtoPath, caffeMeanImageBlob);
    
    } else {
        CoreMLConverter::loadCaffeNetwork(srcPath, caffeWeightsNetwork, caffeProtoTxtPath, caffeNetwork, meanImageProtoPath, caffeMeanImageBlob);
        caffeNetwork = caffeWeightsNetwork;
    }
    
    if (classLabelPath != "") {
	statResult = stat(classLabelPath.c_str(), &buf);
        if (statResult != 0) {
            std::stringstream ss;
            ss << "Unable to open class label file provided in the path: ";
            ss << classLabelPath;
            ss << std::endl;
            throw std::runtime_error(ss.str());
        }
    }
    
    // Convert the caffe network
    Specification::Model modelSpec;
    CoreMLConverter::convertCaffeNetwork(caffeWeightsNetwork, caffeNetwork, caffeMeanImageBlob, modelSpec,
                    isBGR, redBias, blueBias, greenBias, grayBias, scale, imageInputs, classLabelPath,
                    predictedFeatureName);
    
    // Save the format to the model path.
    Result r = saveSpecificationPath(modelSpec, dstPath);
    if (!r.good()) {
        throw std::runtime_error(r.message());
    }
}